

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsort.c
# Opt level: O1

saidx64_t divbwt64(sauchar_t *T,sauchar_t *U,saidx64_t *A,saidx64_t n)

{
  byte bVar1;
  ulong *SA;
  saidx64_t *bucket_A;
  saidx64_t *bucket_B;
  long lVar2;
  long lVar3;
  ulong *puVar4;
  uint uVar5;
  ulong *puVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  saidx64_t sVar11;
  ulong *puVar12;
  ulong *puVar13;
  bool bVar14;
  
  sVar11 = -1;
  if (-1 < n && (U != (sauchar_t *)0x0 && T != (sauchar_t *)0x0)) {
    if (n < 2) {
      sVar11 = n;
      if (n == 1) {
        *U = *T;
      }
    }
    else {
      SA = (ulong *)A;
      if (A == (saidx64_t *)0x0) {
        SA = (ulong *)malloc(n * 8 + 8);
      }
      bucket_A = (saidx64_t *)malloc(0x800);
      bucket_B = (saidx64_t *)malloc(0x80000);
      sVar11 = -2;
      if (bucket_B != (saidx64_t *)0x0 && (bucket_A != (saidx64_t *)0x0 && SA != (ulong *)0x0)) {
        sVar11 = sort_typeBstar(T,(saidx64_t *)SA,bucket_A,bucket_B,n);
        if (0 < sVar11) {
          lVar3 = 0xfe;
          do {
            uVar5 = (uint)(lVar3 << 8);
            lVar2 = bucket_B[(int)(uVar5 | (int)lVar3 + 1U)];
            puVar4 = SA + bucket_A[lVar3 + 1] + -1;
            if (SA + lVar2 <= puVar4) {
              uVar10 = 0xffffffff;
              puVar6 = (ulong *)0x0;
              do {
                uVar9 = *puVar4;
                if ((long)uVar9 < 1) {
                  if (uVar9 != 0) {
                    *puVar4 = ~uVar9;
                  }
                }
                else {
                  bVar1 = T[uVar9 - 1];
                  uVar8 = (ulong)bVar1;
                  *puVar4 = ~uVar8;
                  if (uVar9 == 1) {
                    uVar7 = 0;
                  }
                  else {
                    uVar7 = -uVar9;
                    if (T[uVar9 - 2] <= bVar1) {
                      uVar7 = uVar9 - 1;
                    }
                  }
                  if (uVar10 == bVar1) {
                    uVar8 = (ulong)uVar10;
                  }
                  else {
                    if (-1 < (int)uVar10) {
                      bucket_B[(int)(uVar10 | uVar5)] = (long)puVar6 - (long)SA >> 3;
                    }
                    puVar6 = SA + bucket_B[uVar8 | (long)(int)uVar5];
                  }
                  *puVar6 = uVar7;
                  puVar6 = puVar6 + -1;
                  uVar10 = (uint)uVar8;
                }
                puVar4 = puVar4 + -1;
              } while (SA + lVar2 <= puVar4);
            }
            bVar14 = lVar3 != 0;
            lVar3 = lVar3 + -1;
          } while (bVar14);
        }
        uVar8 = (ulong)T[n + -1];
        uVar9 = ~(ulong)T[n + -2];
        if (T[n + -1] <= T[n + -2]) {
          uVar9 = n - 1;
        }
        puVar4 = SA + bucket_A[uVar8] + 1;
        puVar4[-1] = uVar9;
        puVar6 = SA;
        puVar12 = SA;
        do {
          uVar9 = *puVar6;
          if ((long)uVar9 < 1) {
            puVar13 = puVar6;
            if (uVar9 != 0) {
              *puVar6 = ~uVar9;
              puVar13 = puVar12;
            }
          }
          else {
            bVar1 = T[uVar9 - 1];
            uVar7 = (ulong)bVar1;
            *puVar6 = uVar7;
            if (uVar9 == 1) {
              uVar9 = 0;
            }
            else if (T[uVar9 - 2] < bVar1) {
              uVar9 = ~(ulong)T[uVar9 - 2];
            }
            else {
              uVar9 = uVar9 - 1;
            }
            if ((uint)uVar8 != (uint)bVar1) {
              bucket_A[uVar8] = (long)puVar4 - (long)SA >> 3;
              puVar4 = SA + bucket_A[uVar7];
              uVar8 = uVar7;
            }
            *puVar4 = uVar9;
            puVar4 = puVar4 + 1;
            puVar13 = puVar12;
          }
          puVar6 = puVar6 + 1;
          puVar12 = puVar13;
        } while (puVar6 < SA + n);
        lVar3 = (long)puVar13 - (long)SA >> 3;
        *U = T[n + -1];
        if (lVar3 < 1) {
          lVar2 = 1;
        }
        else {
          lVar2 = 0;
          do {
            U[lVar2 + 1] = (sauchar_t)SA[lVar2];
            lVar2 = lVar2 + 1;
          } while (lVar3 != lVar2);
          lVar2 = lVar3 + 1;
        }
        if (lVar2 < n) {
          do {
            U[lVar2] = (sauchar_t)SA[lVar2];
            lVar2 = lVar2 + 1;
          } while (n != lVar2);
        }
        sVar11 = lVar3 + 1;
      }
      free(bucket_B);
      free(bucket_A);
      if (A == (saidx64_t *)0x0) {
        free(SA);
      }
    }
  }
  return sVar11;
}

Assistant:

saidx_t
divbwt(const sauchar_t *T, sauchar_t *U, saidx_t *A, saidx_t n) {
  saidx_t *B;
  saidx_t *bucket_A, *bucket_B;
  saidx_t m, pidx, i;

  /* Check arguments. */
  if((T == NULL) || (U == NULL) || (n < 0)) { return -1; }
  else if(n <= 1) { if(n == 1) { U[0] = T[0]; } return n; }

  if((B = A) == NULL) { B = (saidx_t *)malloc((size_t)(n + 1) * sizeof(saidx_t)); }
  bucket_A = (saidx_t *)malloc(BUCKET_A_SIZE * sizeof(saidx_t));
  bucket_B = (saidx_t *)malloc(BUCKET_B_SIZE * sizeof(saidx_t));

  /* Burrows-Wheeler Transform. */
  if((B != NULL) && (bucket_A != NULL) && (bucket_B != NULL)) {
    m = sort_typeBstar(T, B, bucket_A, bucket_B, n);
    pidx = construct_BWT(T, B, bucket_A, bucket_B, n, m);

    /* Copy to output string. */
    U[0] = T[n - 1];
    for(i = 0; i < pidx; ++i) { U[i + 1] = (sauchar_t)B[i]; }
    for(i += 1; i < n; ++i) { U[i] = (sauchar_t)B[i]; }
    pidx += 1;
  } else {
    pidx = -2;
  }

  free(bucket_B);
  free(bucket_A);
  if(A == NULL) { free(B); }

  return pidx;
}